

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O1

void __thiscall DROPlayer::ParseFile(DROPlayer *this,UINT32 ticks)

{
  this->_playTick = this->_playTick + ticks;
  if ((this->_playState & 2) == 0) {
    if ((this->_fileHdr).verMajor < 2) {
      if (this->_fileTick <= this->_playTick) {
        do {
          if ((this->_playState & 2) != 0) {
            return;
          }
          DoCommand_v1(this);
        } while (this->_fileTick <= this->_playTick);
      }
    }
    else if (this->_fileTick <= this->_playTick) {
      do {
        if ((this->_playState & 2) != 0) {
          return;
        }
        DoCommand_v2(this);
      } while (this->_fileTick <= this->_playTick);
    }
  }
  return;
}

Assistant:

void DROPlayer::ParseFile(UINT32 ticks)
{
	_playTick += ticks;
	if (_playState & PLAYSTATE_END)
		return;
	
	if (_fileHdr.verMajor < 2)
	{
		while(_fileTick <= _playTick && ! (_playState & PLAYSTATE_END))
			DoCommand_v1();
	}
	else
	{
		while(_fileTick <= _playTick && ! (_playState & PLAYSTATE_END))
			DoCommand_v2();
	}
	
	return;
}